

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O1

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Compress *compression)

{
  Compress CVar1;
  char *pcVar2;
  char *pcVar3;
  
  CVar1 = *compression;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(CVar1) {
  case Zip:
    pcVar3 = "zip";
    pcVar2 = "";
    break;
  case Gzip:
    pcVar3 = "gzip";
    pcVar2 = "";
    break;
  case Bzip2:
    pcVar3 = "bzip2";
    pcVar2 = "";
    break;
  case Xz:
    pcVar3 = "xz";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "none";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Compress& compression)
{
    switch (compression)
    {
    default:
    case Compress::None:    return "none";
    case Compress::Zip:     return "zip";
    case Compress::Gzip:    return "gzip";
    case Compress::Bzip2:   return "bzip2";
    case Compress::Xz:      return "xz";
    }
}